

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

bool load_mpsLine(FILE *file,int *integerVar,int lmax,char *line,char *flag,double *data)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  if (flag[1] == '\0') {
    while (pcVar3 = fgets(line,lmax,(FILE *)file), pcVar3 != (char *)0x0) {
      uVar4 = strlen(line);
      uVar9 = uVar4 & 0xffffffff;
      iVar6 = (int)uVar4 + -1;
      pcVar3 = line + iVar6;
      do {
        iVar7 = iVar6;
        uVar9 = uVar9 - 1;
        uVar10 = uVar4 & 0xffffffff;
        iVar2 = isspace((int)*pcVar3);
        if (iVar7 < 0) break;
        pcVar3 = pcVar3 + -1;
        uVar4 = (ulong)((int)uVar4 - 1);
        iVar6 = iVar7 + -1;
      } while (iVar2 != 0);
      if ((0 < iVar7) && (*line != '*')) {
        for (; (int)uVar10 < 0x18; uVar10 = (ulong)((int)uVar10 + 1)) {
          line[uVar9 + 1] = ' ';
          uVar9 = uVar9 + 1;
        }
        if (uVar9 == 0x17) {
          line[0x18] = '0';
          uVar10 = 0x19;
        }
        line[uVar10] = '\0';
        if (*line != ' ') {
          *flag = *line;
          return false;
        }
        if ((((line[0xe] != '\'') || (line[0xf] != 'M')) || (line[0x10] != 'A')) ||
           (((line[0x11] != 'R' || (line[0x12] != 'K')) ||
            ((line[0x13] != 'E' || (line[0x14] != 'R')))))) {
          cVar1 = line[2];
          if (cVar1 == ' ') {
            cVar1 = line[1];
          }
          *flag = cVar1;
          data[1] = *(double *)(line + 4);
          data[2] = *(double *)(line + 0xe);
          dVar11 = atof(line + 0x18);
          *data = dVar11;
          if ((uint)uVar10 < 0x28) {
            return true;
          }
          flag[1] = '\x01';
          return true;
        }
        pcVar3 = line + (long)line[0x16] + 5;
        do {
          pcVar5 = pcVar3;
          pcVar3 = pcVar5 + 1;
        } while (pcVar5[-5] != '\'');
        if (((pcVar5[-4] == 'I') && (pcVar5[-3] == 'N')) &&
           (((pcVar5[-2] == 'T' &&
             (((pcVar5[-1] == 'O' && (*pcVar5 == 'R')) && (iVar6 = 1, *pcVar3 == 'G')))) ||
            ((((pcVar5[-2] == 'T' && (pcVar5[-1] == 'E')) && (*pcVar5 == 'N')) &&
             (iVar6 = 0, *pcVar3 == 'D')))))) {
          *integerVar = iVar6;
        }
      }
    }
    bVar8 = false;
    printf("load_mpsLine: fgets_rt = %s\n",0);
  }
  else {
    flag[1] = '\0';
    data[2] = *(double *)(line + 0x27);
    dVar11 = atof(line + 0x31);
    *data = dVar11;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool load_mpsLine(FILE *file, int& integerVar, int lmax, char *line, char *flag, double *data) {
    int F1 = 1, F2 = 4, F3 = 14, F4 = 24, F5 = 39, F6 = 49;
    char *fgets_rt;

    // check the buffer
    if (flag[1]) {
        flag[1] = 0;
        memcpy(&data[2], &line[F5], 8);
        data[0] = atof(&line[F6]);
        return true;
    }

    // try to read some to the line
    for (;;) {
        // Line input
        fgets_rt = fgets(line, lmax, file);
	if (fgets_rt == NULL) {
	  printf("load_mpsLine: fgets_rt = %s\n", fgets_rt);
	  return false;
	}
        // Line trim   -- to delete tailing white spaces
        int lcnt = strlen(line) - 1;
        while (isspace(line[lcnt]) && lcnt >= 0)
            lcnt--;
        if (lcnt <= 0 || line[0] == '*')
            continue;

        // Line expand -- to get data easier
        lcnt++;
        while (lcnt < F4)
            line[lcnt++] = ' '; // For row and bound row name
        if (lcnt == F4)
            line[lcnt++] = '0'; // For bound value
        line[lcnt] = '\0';

        // Done with section symbol
        if (line[0] != ' ') {
            flag[0] = line[0];
            return false;
        }

        if (line[F3] == '\'') {
	  if (line[F3+1] == 'M' && line[F3+2] == 'A' && line[F3+3] == 'R' &&
	      line[F3+4] == 'K' && line[F3+5] == 'E' && line[F3+6] == 'R') {
	    int cnter = line[F3+8];
	    while (line[cnter] != '\'')
	      ++cnter;
	    if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		line[cnter+4] == 'O' && line[cnter+5] == 'R' && line[cnter+6] == 'G')
	      integerVar = 1;
	    else if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		     line[cnter+4] == 'E' && line[cnter+5] == 'N' && line[cnter+6] == 'D')
	      integerVar = 0;
	    continue;
	  }
        }

        // Read major symbol & name
	flag[0] = line[F1 + 1] == ' ' ? line[F1] : line[F1 + 1];
	memcpy(&data[1], &line[F2], 8);
        // Read 1st minor name & value to output
        memcpy(&data[2], &line[F3], 8);
        data[0] = atof(&line[F4]);

        // Keep 2nd minor name & value for future
        if (lcnt > F5)
            flag[1] = 1;
        break;
    }

    return true;
}